

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdSchnorrKeyPairTweakAdd
              (void *handle,char *privkey,char *tweak,char **tweaked_pubkey,bool *tweaked_parity,
              char **tweaked_privkey)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  CfdException *pCVar4;
  Privkey privkey_obj;
  Privkey tweaked_privkey_obj;
  char *work_pubkey;
  string local_88;
  undefined8 local_68;
  SchnorrPubkey schnorr_pubkey;
  ByteData256 tweak_obj;
  
  local_68 = 0;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(privkey);
  if (bVar1) {
    privkey_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    privkey_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x212;
    privkey_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdSchnorrKeyPairTweakAdd";
    cfd::core::logger::warn<>((CfdSourceLocation *)&privkey_obj,"privkey is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&privkey_obj,"Failed to parameter. privkey is null or empty.",
               (allocator *)&tweaked_privkey_obj);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&privkey_obj);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(tweak);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&privkey_obj,tweak,(allocator *)&tweaked_privkey_obj);
    cfd::core::ByteData256::ByteData256(&tweak_obj,(string *)&privkey_obj);
    std::__cxx11::string::~string((string *)&privkey_obj);
    std::__cxx11::string::string((string *)&tweaked_privkey_obj,privkey,(allocator *)&local_88);
    cfd::core::Privkey::Privkey(&privkey_obj,(string *)&tweaked_privkey_obj,kMainnet,true);
    std::__cxx11::string::~string((string *)&tweaked_privkey_obj);
    cfd::core::Privkey::Privkey(&tweaked_privkey_obj);
    cfd::core::SchnorrPubkey::CreateTweakAddFromPrivkey
              (&schnorr_pubkey,&privkey_obj,&tweak_obj,&tweaked_privkey_obj,tweaked_parity);
    if (tweaked_pubkey == (char **)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_88,&schnorr_pubkey);
      pcVar2 = cfd::capi::CreateString(&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    if (tweaked_privkey == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::Privkey::GetHex_abi_cxx11_(&local_88,&tweaked_privkey_obj);
      pcVar3 = cfd::capi::CreateString(&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    if (tweaked_pubkey != (char **)0x0) {
      *tweaked_pubkey = pcVar2;
    }
    if (tweaked_privkey != (char **)0x0) {
      *tweaked_privkey = pcVar3;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweaked_privkey_obj);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey_obj);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_obj);
    return 0;
  }
  privkey_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
  privkey_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x218;
  privkey_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdSchnorrKeyPairTweakAdd";
  cfd::core::logger::warn<>((CfdSourceLocation *)&privkey_obj,"tweak is null or empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&privkey_obj,"Failed to parameter. tweak is null or empty.",
             (allocator *)&tweaked_privkey_obj);
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&privkey_obj);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSchnorrKeyPairTweakAdd(
    void* handle, const char* privkey, const char* tweak,
    char** tweaked_pubkey, bool* tweaked_parity, char** tweaked_privkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_pubkey = nullptr;
  char* work_privkey = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }
    if (IsEmptyString(tweak)) {
      warn(CFD_LOG_SOURCE, "tweak is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweak is null or empty.");
    }

    ByteData256 tweak_obj = ByteData256(std::string(tweak));
    Privkey privkey_obj = Privkey(std::string(privkey));
    Privkey tweaked_privkey_obj;
    SchnorrPubkey schnorr_pubkey = SchnorrPubkey::CreateTweakAddFromPrivkey(
        privkey_obj, tweak_obj, &tweaked_privkey_obj, tweaked_parity);
    if (tweaked_pubkey != nullptr) {
      work_pubkey = CreateString(schnorr_pubkey.GetHex());
    }
    if (tweaked_privkey != nullptr) {
      work_privkey = CreateString(tweaked_privkey_obj.GetHex());
    }

    if (tweaked_pubkey != nullptr) *tweaked_pubkey = work_pubkey;
    if (tweaked_privkey != nullptr) *tweaked_privkey = work_privkey;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_pubkey, &work_privkey);
  return result;
}